

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_close_cb(void *arg)

{
  ws_frame *frame;
  
  nni_aio_close((nni_aio *)((long)arg + 0xf8));
  nni_aio_close((nni_aio *)((long)arg + 0x2c0));
  nni_aio_close((nni_aio *)((long)arg + 0x650));
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  nni_http_conn_close(*(nni_http_conn **)((long)arg + 0x9e8));
  while( true ) {
    frame = (ws_frame *)nni_list_first((nni_list *)((long)arg + 0xb8));
    if (frame == (ws_frame *)0x0) break;
    nni_list_remove((nni_list *)((long)arg + 0xb8),frame);
    if (frame->aio != (nni_aio *)0x0) {
      nni_aio_list_remove(frame->aio);
      nni_aio_finish_error(frame->aio,NNG_ECLOSED);
    }
    ws_frame_fini(frame);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return;
}

Assistant:

static void
ws_close_cb(void *arg)
{
	nni_ws   *ws = arg;
	ws_frame *frame;

	nni_aio_close(&ws->txaio);
	nni_aio_close(&ws->rxaio);
	nni_aio_close(&ws->httpaio);

	// Either we sent a close frame, or we didn't.  Either way,
	// we are done, and its time to abort everything else.
	nni_mtx_lock(&ws->mtx);

	nni_http_conn_close(ws->http);

	while ((frame = nni_list_first(&ws->txq)) != NULL) {
		nni_list_remove(&ws->txq, frame);
		if (frame->aio != NULL) {
			nni_aio_list_remove(frame->aio);
			nni_aio_finish_error(frame->aio, NNG_ECLOSED);
		}
		ws_frame_fini(frame);
	}

	// Any txframe should have been killed with its wmsg.
	nni_mtx_unlock(&ws->mtx);
}